

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O0

void upb::generator::AddEnums
               (MessageDefPtr message,
               vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *enums,WhichEnums which)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  MessageDefPtr message_00;
  int local_34;
  EnumDefPtr EStack_30;
  int i_1;
  EnumDefPtr local_28;
  EnumDefPtr enum_type;
  int i;
  WhichEnums which_local;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *enums_local;
  MessageDefPtr message_local;
  
  enum_type.ptr_._4_4_ = which;
  enums_local = (vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> *)message.ptr_;
  sVar4 = std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::size(enums);
  iVar2 = MessageDefPtr::enum_type_count((MessageDefPtr *)&enums_local);
  std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::reserve(enums,sVar4 + (long)iVar2)
  ;
  for (enum_type.ptr_._0_4_ = 0; iVar2 = (int)enum_type.ptr_,
      iVar3 = MessageDefPtr::enum_type_count((MessageDefPtr *)&enums_local), iVar2 < iVar3;
      enum_type.ptr_._0_4_ = (int)enum_type.ptr_ + 1) {
    local_28 = MessageDefPtr::enum_type((MessageDefPtr *)&enums_local,(int)enum_type.ptr_);
    if ((enum_type.ptr_._4_4_ == kAllEnums) || (bVar1 = EnumDefPtr::is_closed(&local_28), bVar1)) {
      EStack_30 = MessageDefPtr::enum_type((MessageDefPtr *)&enums_local,(int)enum_type.ptr_);
      std::vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::push_back
                (enums,&stack0xffffffffffffffd0);
    }
  }
  for (local_34 = 0; iVar2 = MessageDefPtr::nested_message_count((MessageDefPtr *)&enums_local),
      local_34 < iVar2; local_34 = local_34 + 1) {
    message_00 = MessageDefPtr::nested_message((MessageDefPtr *)&enums_local,local_34);
    AddEnums(message_00,enums,enum_type.ptr_._4_4_);
  }
  return;
}

Assistant:

void AddEnums(upb::MessageDefPtr message, std::vector<upb::EnumDefPtr>* enums,
              WhichEnums which) {
  enums->reserve(enums->size() + message.enum_type_count());
  for (int i = 0; i < message.enum_type_count(); i++) {
    upb::EnumDefPtr enum_type = message.enum_type(i);
    if (which == kAllEnums || enum_type.is_closed()) {
      enums->push_back(message.enum_type(i));
    }
  }
  for (int i = 0; i < message.nested_message_count(); i++) {
    AddEnums(message.nested_message(i), enums, which);
  }
}